

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O3

void __thiscall jsonip::writer<true>::object_start(writer<true> *this)

{
  ostream *poVar1;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pre(this);
  local_48._0_1_ = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&local_48,1);
  this->level = this->level + 1;
  local_48 = (long *)CONCAT71(local_48._1_7_,10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&local_48,1);
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->level * '\x02');
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_48,local_40);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  this->comma = false;
  return;
}

Assistant:

void object_start()
        {
            pre();
            os << '{';
            ++level;
            if (indent_)
            {
                os << '\n' << indent();
            }
            comma = false;
        }